

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O2

bool __thiscall Js::ByteCodeWriter::DoProfileNewScObjectOp(ByteCodeWriter *this,OpCode op)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineConstructorsPhase,sourceContextId,
                            functionId);
  return !bVar1 && (op == NewScObjectSpread || op == NewScObject);
}

Assistant:

bool DoProfileNewScObjectOp(OpCode op)
        {
            return
                !PHASE_OFF(InlineConstructorsPhase, m_functionWrite) &&
                (op == OpCode::NewScObject || op == OpCode::NewScObjectSpread);
        }